

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.cpp
# Opt level: O2

void advance(FM_OPL *OPL,int loch,int hich)

{
  UINT32 *pUVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  UINT32 UVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  bool bVar13;
  
  uVar3 = OPL->eg_timer + OPL->eg_timer_add;
  OPL->eg_timer = uVar3;
  uVar11 = (ulong)(uint)LFO_PM;
  do {
    bVar13 = uVar3 < OPL->eg_timer_overflow;
    uVar3 = uVar3 - OPL->eg_timer_overflow;
    if (bVar13) {
      return;
    }
    OPL->eg_timer = uVar3;
    uVar12 = OPL->eg_cnt + 1;
    OPL->eg_cnt = uVar12;
    for (uVar10 = loch * 2; (int)uVar10 <= hich * 2 + 1; uVar10 = uVar10 + 1) {
      iVar4 = (int)uVar10 / 2;
      uVar5 = uVar10 & 1;
      switch(OPL->P_CH[iVar4].SLOT[uVar5].state) {
      case '\x01':
        bVar2 = OPL->P_CH[iVar4].SLOT[uVar5].eg_sh_rr;
        if (((uVar12 & ~(-1 << (bVar2 & 0x1f))) == 0) &&
           (iVar6 = (uint)""[(ulong)(uVar12 >> (bVar2 & 0x1f) & 7) +
                             (ulong)OPL->P_CH[iVar4].SLOT[uVar5].eg_sel_rr] +
                    OPL->P_CH[iVar4].SLOT[uVar5].volume, OPL->P_CH[iVar4].SLOT[uVar5].volume = iVar6
           , 0x1fe < iVar6)) {
          OPL->P_CH[iVar4].SLOT[uVar5].volume = 0x1ff;
          OPL->P_CH[iVar4].SLOT[uVar5].state = '\0';
        }
        break;
      case '\x02':
        if ((OPL->P_CH[iVar4].SLOT[uVar5].eg_type == '\0') &&
           (bVar2 = OPL->P_CH[iVar4].SLOT[uVar5].eg_sh_rr, (uVar12 & ~(-1 << (bVar2 & 0x1f))) == 0))
        {
          iVar6 = (uint)""[(ulong)(uVar12 >> (bVar2 & 0x1f) & 7) +
                           (ulong)OPL->P_CH[iVar4].SLOT[uVar5].eg_sel_rr] +
                  OPL->P_CH[iVar4].SLOT[uVar5].volume;
          if (0x1fe < iVar6) {
            iVar6 = 0x1ff;
          }
          OPL->P_CH[iVar4].SLOT[uVar5].volume = iVar6;
        }
        break;
      case '\x03':
        bVar2 = OPL->P_CH[iVar4].SLOT[uVar5].eg_sh_dr;
        if (((uVar12 & ~(-1 << (bVar2 & 0x1f))) == 0) &&
           (iVar6 = (uint)""[(ulong)(uVar12 >> (bVar2 & 0x1f) & 7) +
                             (ulong)OPL->P_CH[iVar4].SLOT[uVar5].eg_sel_dr] +
                    OPL->P_CH[iVar4].SLOT[uVar5].volume, OPL->P_CH[iVar4].SLOT[uVar5].volume = iVar6
           , (int)OPL->P_CH[iVar4].SLOT[uVar5].sl <= iVar6)) {
          OPL->P_CH[iVar4].SLOT[uVar5].state = '\x02';
        }
        break;
      case '\x04':
        bVar2 = OPL->P_CH[iVar4].SLOT[uVar5].eg_sh_ar;
        if ((uVar12 & ~(-1 << (bVar2 & 0x1f))) == 0) {
          uVar9 = OPL->P_CH[iVar4].SLOT[uVar5].volume;
          iVar6 = (int)((uint)""[(ulong)(uVar12 >> (bVar2 & 0x1f) & 7) +
                                 (ulong)OPL->P_CH[iVar4].SLOT[uVar5].eg_sel_ar] * ~uVar9) >> 3;
          iVar7 = iVar6 + uVar9;
          OPL->P_CH[iVar4].SLOT[uVar5].volume = iVar7;
          if (iVar7 == 0 || SCARRY4(iVar6,uVar9) != iVar7 < 0) {
            OPL->P_CH[iVar4].SLOT[uVar5].volume = 0;
            OPL->P_CH[iVar4].SLOT[uVar5].state = '\x03';
          }
        }
      }
      if (OPL->P_CH[iVar4].SLOT[uVar5].vib == '\0') {
LAB_0033c82a:
        UVar8 = OPL->P_CH[iVar4].SLOT[uVar5].Incr;
      }
      else {
        uVar9 = OPL->P_CH[iVar4].block_fnum;
        if (""[(uVar9 >> 3 & 0x70) + uVar11] == '\0') goto LAB_0033c82a;
        uVar9 = uVar9 + (int)""[(uVar9 >> 3 & 0x70) + uVar11];
        UVar8 = (uint)OPL->P_CH[iVar4].SLOT[uVar5].mul *
                (OPL->fn_tab[uVar9 & 0x3ff] >> (~(byte)(uVar9 >> 10) & 7));
      }
      pUVar1 = &OPL->P_CH[iVar4].SLOT[uVar5].Cnt;
      *pUVar1 = *pUVar1 + UVar8;
    }
  } while( true );
}

Assistant:

INLINE void advance(FM_OPL *OPL, int loch, int hich)
{
	OPL_CH *CH;
	OPL_SLOT *op;
	int i;

	OPL->eg_timer += OPL->eg_timer_add;
	loch *= 2;
	hich *= 2;

	while (OPL->eg_timer >= OPL->eg_timer_overflow)
	{
		OPL->eg_timer -= OPL->eg_timer_overflow;

		OPL->eg_cnt++;

		for (i = loch; i <= hich + 1; i++)
		{
			CH  = &OPL->P_CH[i/2];
			op  = &CH->SLOT[i&1];

			/* Envelope Generator */
			switch(op->state)
			{
			case EG_ATT:		/* attack phase */
				if ( !(OPL->eg_cnt & ((1<<op->eg_sh_ar)-1) ) )
				{
					op->volume += (~op->volume *
	                        		           (eg_inc[op->eg_sel_ar + ((OPL->eg_cnt>>op->eg_sh_ar)&7)])
        			                          ) >>3;

					if (op->volume <= MIN_ATT_INDEX)
					{
						op->volume = MIN_ATT_INDEX;
						op->state = EG_DEC;
					}

				}
			break;

			case EG_DEC:	/* decay phase */
				if ( !(OPL->eg_cnt & ((1<<op->eg_sh_dr)-1) ) )
				{
					op->volume += eg_inc[op->eg_sel_dr + ((OPL->eg_cnt>>op->eg_sh_dr)&7)];

					if ( op->volume >= (INT32)op->sl )
						op->state = EG_SUS;

				}
			break;

			case EG_SUS:	/* sustain phase */

				/* this is important behaviour:
				one can change percusive/non-percussive modes on the fly and
				the chip will remain in sustain phase - verified on real YM3812 */

				if(op->eg_type)		/* non-percussive mode */
				{
									/* do nothing */
				}
				else				/* percussive mode */
				{
					/* during sustain phase chip adds Release Rate (in percussive mode) */
					if ( !(OPL->eg_cnt & ((1<<op->eg_sh_rr)-1) ) )
					{
						op->volume += eg_inc[op->eg_sel_rr + ((OPL->eg_cnt>>op->eg_sh_rr)&7)];

						if ( op->volume >= MAX_ATT_INDEX )
							op->volume = MAX_ATT_INDEX;
					}
					/* else do nothing in sustain phase */
				}
			break;

			case EG_REL:	/* release phase */
				if ( !(OPL->eg_cnt & ((1<<op->eg_sh_rr)-1) ) )
				{
					op->volume += eg_inc[op->eg_sel_rr + ((OPL->eg_cnt>>op->eg_sh_rr)&7)];

					if ( op->volume >= MAX_ATT_INDEX )
					{
						op->volume = MAX_ATT_INDEX;
						op->state = EG_OFF;
					}

				}
			break;

			default:
			break;
			}

			/* Phase Generator */
			if(op->vib)
			{
				UINT8 block;
				unsigned int block_fnum = CH->block_fnum;

				unsigned int fnum_lfo   = (block_fnum&0x0380) >> 7;

				signed int lfo_fn_table_index_offset = lfo_pm_table[LFO_PM + 16*fnum_lfo ];

				if (lfo_fn_table_index_offset)	/* LFO phase modulation active */
				{
					block_fnum += lfo_fn_table_index_offset;
					block = (block_fnum&0x1c00) >> 10;
					op->Cnt += (OPL->fn_tab[block_fnum&0x03ff] >> (7-block)) * op->mul;
				}
				else	/* LFO phase modulation  = zero */
				{
					op->Cnt += op->Incr;
				}
			}
			else	/* LFO phase modulation disabled for this operator */
			{
				op->Cnt += op->Incr;
			}
		}
	}
}